

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Istream *this_00;
  Index IVar1;
  bool bVar2;
  Index IVar3;
  u32 val;
  size_type sVar4;
  Location local_150;
  Var local_130;
  Location local_e8;
  Enum local_c8;
  Enum local_c4;
  Enum local_c0;
  u32 local_bc;
  u32 local_b8;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  FuncType *func_type;
  Var local_88;
  Location local_40;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index func_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = func_index;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  IVar1 = local_1c;
  GetLocation((Location *)&func_type,this);
  Var::Var(&local_88,IVar1,(Location *)&func_type);
  local_20 = (Enum)SharedValidator::OnReturnCall(&this->validator_,&local_40,&local_88);
  bVar2 = Failed((Result)local_20);
  Var::~Var(&local_88);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    _keep_count = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
                  operator[](&this->func_types_,(ulong)local_1c);
    local_c0 = (Enum)GetReturnCallDropKeepCount(this,_keep_count,0,&catch_drop_count,&local_b8);
    bVar2 = Failed((Result)local_c0);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      sVar4 = std::
              vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
              ::size(&this->label_stack_);
      local_c4 = (Enum)SharedValidator::GetCatchCount(&this->validator_,(int)sVar4 - 1,&local_bc);
      bVar2 = Failed((Result)local_c4);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        GetLocation(&local_e8,this);
        IVar1 = local_1c;
        GetLocation(&local_150,this);
        Var::Var(&local_130,IVar1,&local_150);
        local_c8 = (Enum)SharedValidator::OnReturnCall(&this->validator_,&local_e8,&local_130);
        bVar2 = Failed((Result)local_c8);
        Var::~Var(&local_130);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          Istream::EmitDropKeep(this->istream_,catch_drop_count,local_b8);
          Istream::EmitCatchDrop(this->istream_,local_bc);
          IVar1 = local_1c;
          IVar3 = num_func_imports(this);
          if (IVar1 < IVar3) {
            Istream::Emit(this->istream_,InterpCallImport,local_1c);
            Istream::Emit(this->istream_,Return);
          }
          else {
            Istream::Emit(this->istream_,InterpAdjustFrameForReturnCall,local_1c);
            Istream::Emit(this->istream_,Br);
            this_00 = this->istream_;
            val = GetFuncOffset(this,local_1c);
            Istream::Emit(this_00,val);
          }
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallExpr(Index func_index) {
  CHECK_RESULT(
      validator_.OnReturnCall(GetLocation(), Var(func_index, GetLocation())));

  FuncType& func_type = func_types_[func_index];

  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, 0, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  // The validator must be run after we get the drop/keep counts, since it
  // will change the type stack.
  CHECK_RESULT(
      validator_.OnReturnCall(GetLocation(), Var(func_index, GetLocation())));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::InterpAdjustFrameForReturnCall, func_index);
    istream_.Emit(Opcode::Br);
    // We emit this separately to ensure that the fixup generated by
    // GetFuncOffset comes after the Br opcode.
    istream_.Emit(GetFuncOffset(func_index));
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
    istream_.Emit(Opcode::Return);
  }

  return Result::Ok;
}